

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O1

void Timidity::convert_sample_data(Sample *sp,void *data)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  sample_t *psVar4;
  long lVar5;
  SBYTE *cp;
  float fVar6;
  
  iVar2 = sp->data_length;
  iVar3 = iVar2 >> 1;
  switch(sp->modes & 3) {
  case 0:
    psVar4 = (sample_t *)safe_malloc((long)iVar2 * 4 + 4);
    iVar2 = sp->data_length;
    if (0 < (long)iVar2) {
      lVar5 = 0;
      do {
        psVar4[lVar5] =
             (float)(int)(char)*(byte *)((long)data + lVar5) *
             *(float *)(&DAT_005e16a8 + (ulong)(*(byte *)((long)data + lVar5) >> 7) * 4);
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    break;
  case 1:
    sp->data_length = iVar3;
    sp->loop_start = sp->loop_start >> 1;
    sp->loop_end = sp->loop_end >> 1;
    psVar4 = (sample_t *)safe_malloc((long)iVar3 * 4 + 4);
    iVar2 = sp->data_length;
    if (0 < (long)iVar2) {
      lVar5 = 0;
      do {
        uVar1 = *(ushort *)((long)data + lVar5 * 2);
        fVar6 = (float)(int)(short)uVar1 * 3.0517578e-05;
        if (-1 < (short)uVar1) {
          fVar6 = (float)uVar1 * 3.051851e-05;
        }
        psVar4[lVar5] = fVar6;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    break;
  case 2:
    psVar4 = (sample_t *)safe_malloc((long)iVar2 * 4 + 4);
    iVar2 = sp->data_length;
    if (0 < (long)iVar2) {
      lVar5 = 0;
      do {
        psVar4[lVar5] =
             (float)(int)(*(byte *)((long)data + lVar5) - 0x80) *
             *(float *)(&DAT_005e16a0 + (ulong)(*(byte *)((long)data + lVar5) >> 7) * 4);
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    break;
  case 3:
    sp->data_length = iVar3;
    sp->loop_start = sp->loop_start >> 1;
    sp->loop_end = sp->loop_end >> 1;
    psVar4 = (sample_t *)safe_malloc((long)iVar3 * 4 + 4);
    iVar2 = sp->data_length;
    if (0 < (long)iVar2) {
      lVar5 = 0;
      do {
        uVar1 = *(ushort *)((long)data + lVar5 * 2);
        psVar4[lVar5] =
             (float)(int)(uVar1 - 0x8000) * *(float *)(&DAT_005e1698 + (ulong)(uVar1 >> 0xf) * 4);
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
  }
  psVar4[sp->data_length] = psVar4[(long)sp->data_length + -1];
  if (sp->data != (sample_t *)0x0) {
    free(sp->data);
  }
  sp->data = psVar4;
  return;
}

Assistant:

void convert_sample_data(Sample *sp, const void *data)
{
	/* convert everything to 32-bit floating point data */
	sample_t *newdata = NULL;

	switch (sp->modes & (PATCH_16 | PATCH_UNSIGNED))
	{
	case 0:
	  {					/* 8-bit, signed */
		SBYTE *cp = (SBYTE *)data;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			if (cp[i] < 0)
			{
				newdata[i] = float(cp[i]) / 128.f;
			}
			else
			{
				newdata[i] = float(cp[i]) / 127.f;
			}
		}
		break;
	  }

	case PATCH_UNSIGNED:
	  {					/* 8-bit, unsigned */
		BYTE *cp = (BYTE *)data;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = cp[i] - 128;
			if (c < 0)
			{
				newdata[i] = float(c) / 128.f;
			}
			else
			{
				newdata[i] = float(c) / 127.f;
			}
		}
		break;
	  }

	case PATCH_16:
	  {					/* 16-bit, signed */
		SWORD *cp = (SWORD *)data;
		/* Convert these to samples */
		sp->data_length >>= 1;
		sp->loop_start >>= 1;
		sp->loop_end >>= 1;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = LittleShort(cp[i]);
			if (c < 0)
			{
				newdata[i] = float(c) / 32768.f;
			}
			else
			{
				newdata[i] = float(c) / 32767.f;
			}
		}
		break;
	  }

	case PATCH_16 | PATCH_UNSIGNED:
	  {					/* 16-bit, unsigned */
		WORD *cp = (WORD *)data;
		/* Convert these to samples */
		sp->data_length >>= 1;
		sp->loop_start >>= 1;
		sp->loop_end >>= 1;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = LittleShort(cp[i]) - 32768;
			if (c < 0)
			{
				newdata[i] = float(c) / 32768.f;
			}
			else
			{
				newdata[i] = float(c) / 32767.f;
			}
		}
		break;
	  }
	}
	/* Duplicate the final sample for linear interpolation. */
	newdata[sp->data_length] = newdata[sp->data_length - 1];
	if (sp->data != NULL)
	{
		free(sp->data);
	}
	sp->data = newdata;
}